

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
resizeHelper<false,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Marray<int,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,int *value)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined8 begin_00;
  undefined8 end_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  begin_01;
  int *data;
  size_t sVar3;
  runtime_error *prVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  size_type __n;
  int iVar9;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape1;
  size_t x;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> base1;
  View<int,_false,_std::allocator<unsigned_long>_> view2;
  View<int,_false,_std::allocator<unsigned_long>_> viewT;
  undefined1 local_178 [16];
  unsigned_long *local_168;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  int *local_130;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  undefined1 local_120 [32];
  undefined1 local_100 [16];
  size_t local_f0;
  CoordinateOrder local_e8;
  bool local_e4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_c8;
  undefined1 local_b0 [32];
  undefined1 local_90 [16];
  size_t local_80;
  CoordinateOrder local_78;
  bool local_74;
  undefined1 local_70 [16];
  size_t *local_60;
  size_t local_48;
  long lVar11;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] == (Marray<int,std::allocator<unsigned_long>>)0x0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Assertion failed.");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_178 = (undefined1  [16])0x0;
  local_168 = (unsigned_long *)0x0;
  __n = 1;
  local_130 = value;
  local_128._M_current = begin._M_current;
  if (begin._M_current != end._M_current) {
    do {
      local_120._0_8_ = *begin._M_current;
      if ((pointer)local_120._0_8_ == (pointer)0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Assertion failed.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((unsigned_long *)local_178._8_8_ == local_168) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_178,
                   (iterator)local_178._8_8_,(unsigned_long *)local_120);
      }
      else {
        *(undefined8 *)local_178._8_8_ = local_120._0_8_;
        local_178._8_8_ = (unsigned_long *)(local_178._8_8_ + 8);
      }
      __n = __n * local_120._0_8_;
      begin._M_current = begin._M_current + 1;
    } while (begin._M_current != end._M_current);
  }
  data = __gnu_cxx::new_allocator<int>::allocate
                   ((new_allocator<int> *)(this + 0x40),__n,(void *)0x0);
  begin_01._M_current = local_128._M_current;
  auVar2 = _DAT_002380d0;
  if (__n == 0) {
    piVar7 = *(int **)this;
    if (piVar7 == (int *)0x0) goto LAB_00236c06;
LAB_002368d8:
    if (*(size_type *)(this + 0x28) != 0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_c8,*(size_type *)(this + 0x28),(allocator_type *)local_120);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_e0,(long)(local_178._8_8_ - local_178._0_8_) >> 3,
                 (allocator_type *)local_120);
      if (*(long *)this == 0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,"Assertion failed.");
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_120._0_8_ = (pointer)0x1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_148,*(size_type *)(this + 0x28),(value_type *)local_120,
                 (allocator_type *)local_70);
      local_120._0_8_ = (pointer)0x1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_160,(long)(local_178._8_8_ - local_178._0_8_) >> 3,(value_type *)local_120,
                 (allocator_type *)local_70);
      if (*(long *)this != 0) {
        uVar5 = 0;
        do {
          uVar6 = (long)(local_178._8_8_ - local_178._0_8_) >> 3;
          if (*(ulong *)(this + 0x28) <= uVar6) {
            uVar6 = *(ulong *)(this + 0x28);
          }
          if (uVar6 <= uVar5) {
            local_120._0_8_ = (pointer)0x0;
            local_120._16_16_ = (undefined1  [16])0x0;
            local_100 = (undefined1  [16])0x0;
            local_f0 = 0;
            local_e8 = LastMajorOrder;
            local_e4 = true;
            View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_120);
            View<int,false,std::allocator<unsigned_long>>::
            constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((View<int,false,std::allocator<unsigned_long>> *)this,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (View<int,_true,_std::allocator<unsigned_long>_> *)local_120);
            begin_00 = local_178._0_8_;
            end_00 = local_178._8_8_;
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
            local_70._0_8_ = data;
            marray_detail::Geometry<std::allocator<unsigned_long>>::
            Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((Geometry<std::allocator<unsigned_long>> *)(local_70 + 8),
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )begin_00,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )end_00,(CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),
                       (allocator_type *)local_b0);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_70);
            local_b0._0_8_ = (pointer)0x0;
            local_b0._16_16_ = (undefined1  [16])0x0;
            local_90 = (undefined1  [16])0x0;
            local_80 = 0;
            local_78 = LastMajorOrder;
            local_74 = true;
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
            View<int,false,std::allocator<unsigned_long>>::
            view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                      ((View<int,false,std::allocator<unsigned_long>> *)local_70,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        )local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
            View<int,_true,_std::allocator<unsigned_long>_>::squeeze
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_120);
            View<int,_false,_std::allocator<unsigned_long>_>::squeeze
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
            marray_detail::
            AssignmentOperatorHelper<false,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
            ::execute((View<int,_true,_std::allocator<unsigned_long>_> *)local_120,
                      (View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
            View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b0);
            operator_delete((void *)local_b0._16_8_,local_90._8_8_ * 0x18);
            operator_delete(local_60,local_48 * 0x18);
            operator_delete((void *)local_120._16_8_,local_100._8_8_ * 0x18);
            if (local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_160.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_160.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_160.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_148.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_148.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_148.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_e0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_e0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_e0.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
              operator_delete(local_c8.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_c8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            piVar7 = *(int **)this;
            goto LAB_00236bf2;
          }
          sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::shape
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,uVar5);
          uVar6 = *(ulong *)(local_178._0_8_ + uVar5 * 8);
          if (uVar6 < sVar3) {
            sVar3 = uVar6;
          }
          local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = sVar3;
          local_160.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] = sVar3;
          uVar5 = uVar5 + 1;
        } while (*(long *)this != 0);
      }
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Assertion failed.");
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    iVar1 = *local_130;
    lVar11 = __n - 1;
    auVar8._8_4_ = (int)lVar11;
    auVar8._0_8_ = lVar11;
    auVar8._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar5 = 0;
    auVar8 = auVar8 ^ _DAT_002380d0;
    auVar10 = _DAT_00238070;
    auVar12 = _DAT_00238080;
    do {
      auVar13 = auVar12 ^ auVar2;
      iVar9 = auVar8._4_4_;
      if ((bool)(~(auVar13._4_4_ == iVar9 && auVar8._0_4_ < auVar13._0_4_ || iVar9 < auVar13._4_4_)
                & 1)) {
        data[uVar5] = iVar1;
      }
      if ((auVar13._12_4_ != auVar8._12_4_ || auVar13._8_4_ <= auVar8._8_4_) &&
          auVar13._12_4_ <= auVar8._12_4_) {
        data[uVar5 + 1] = iVar1;
      }
      auVar13 = auVar10 ^ auVar2;
      iVar14 = auVar13._4_4_;
      if (iVar14 <= iVar9 && (iVar14 != iVar9 || auVar13._0_4_ <= auVar8._0_4_)) {
        data[uVar5 + 2] = iVar1;
        data[uVar5 + 3] = iVar1;
      }
      uVar5 = uVar5 + 4;
      lVar11 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 4;
      auVar12._8_8_ = lVar11 + 4;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar11 + 4;
    } while ((__n + 3 & 0xfffffffffffffffc) != uVar5);
    piVar7 = *(int **)this;
    if (piVar7 == (int *)0x0) goto LAB_00236c06;
    if (__n != 1) goto LAB_002368d8;
  }
  *data = *piVar7;
LAB_00236bf2:
  operator_delete(piVar7,*(long *)(this + 0x30) << 2);
  *(undefined8 *)this = 0;
LAB_00236c06:
  View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)this,begin_01,end,data,
             (CoordinateOrder *)(this + 0x38),(CoordinateOrder *)(this + 0x38),
             (allocator_type *)local_120);
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  if (this[0x3c] != (Marray<int,std::allocator<unsigned_long>>)0x0) {
    if ((void *)local_178._0_8_ != (void *)0x0) {
      operator_delete((void *)local_178._0_8_,(long)local_168 - local_178._0_8_);
    }
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Assertion failed.");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void
Marray<T, A>::resizeHelper
(
    ShapeIterator begin,
    ShapeIterator end,
    const T& value
)
{   
    testInvariant();
    // compute size
    std::vector<std::size_t> newShape;
    std::size_t newSize = 1;
    for(ShapeIterator it = begin; it != end; ++it) {
        std::size_t x = static_cast<std::size_t>(*it);
        marray_detail::Assert(MARRAY_NO_ARG_TEST || x > 0);
        newShape.push_back(x);
        newSize *= x;
    }
    // allocate new
    value_type* newData = dataAllocator_.allocate(newSize); 
    if(!SKIP_INITIALIZATION) {
        for(std::size_t j=0; j<newSize; ++j) {
            newData[j] = value;
        }
    }
    // copy old data in region of overlap
    if(this->data_ != 0) {
        if(newSize == 1 || this->dimension() == 0) {
            newData[0] = this->data_[0];
        }
        else {
            std::vector<std::size_t> base1(this->dimension());
            std::vector<std::size_t> base2(newShape.size());
            std::vector<std::size_t> shape1(this->dimension(), 1);
            std::vector<std::size_t> shape2(newShape.size(), 1);
            for(std::size_t j=0; j<std::min(this->dimension(), newShape.size()); ++j) {
                shape1[j] = std::min(this->shape(j), newShape[j]);
                shape2[j] = shape1[j];
            }
            View<T, true, A> view1;
            this->constView(base1.begin(), shape1.begin(), view1);
            View<T, false, A> viewT(newShape.begin(), newShape.end(),
                newData, this->coordinateOrder(),
                this->coordinateOrder());
            View<T, false, A> view2;
            viewT.view(base2.begin(), shape2.begin(), view2);
            view1.squeeze();
            view2.squeeze();
            view2 = view1; // copy
        }
        dataAllocator_.deallocate(this->data_, this->size()); 
        this->data_ = 0;
    }
    base::assign(begin, end, newData, this->geometry_.coordinateOrder(),
        this->geometry_.coordinateOrder());
    testInvariant();
}